

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O1

string * __thiscall
OpenGliderConnection::GetStatusText_abi_cxx11_
          (string *__return_storage_ptr__,OpenGliderConnection *this)

{
  float fVar1;
  char buf [50];
  char acStack_48 [56];
  
  LTChannel::GetStatusText_abi_cxx11_(__return_storage_ptr__,(LTChannel *)this);
  if (!NAN(this->aprsLastData)) {
    fVar1 = DataRefs::GetMiscNetwTime(&dataRefs);
    snprintf(acStack_48,0x32," | last msg %.0fs ago",(double)(fVar1 - this->aprsLastData));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenGliderConnection::GetStatusText () const
{
    // Let's start with the standard text
    std::string s (LTChannel::GetStatusText());
    // if we have a latest APRS timestamp then we add age of last APRS message
    if (!std::isnan(aprsLastData)) {
        char buf[50];
        snprintf(buf, sizeof(buf), " | last msg %.0fs ago",
                 dataRefs.GetMiscNetwTime() - aprsLastData);
        s += buf;
    }
    return s;
}